

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  int iVar1;
  char *p_00;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  sqlite3_int64 iSave;
  char *pSave;
  sqlite3_int64 iPos2;
  sqlite3_int64 iPos1;
  sqlite3_int64 iPrev;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char **in_stack_ffffffffffffff70;
  int local_88;
  int local_84;
  int local_44;
  uint local_28;
  uint local_24;
  byte *local_20;
  byte *local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (char *)*in_RDI;
  local_18 = (byte *)*in_R8;
  local_20 = (byte *)*in_R9;
  local_24 = 0;
  local_28 = 0;
  if (*local_18 == 1) {
    local_18 = local_18 + 1;
    if ((*local_18 & 0x80) == 0) {
      local_24 = (uint)*local_18;
      local_84 = 1;
    }
    else {
      local_84 = sqlite3Fts3GetVarint32((char *)local_18,(int *)&local_24);
    }
    local_18 = local_18 + local_84;
    if (local_24 == 0) {
      local_44 = 0;
      goto LAB_0025035c;
    }
  }
  if (*local_20 == 1) {
    local_20 = local_20 + 1;
    if ((*local_20 & 0x80) == 0) {
      local_28 = (uint)*local_20;
      local_88 = 1;
    }
    else {
      local_88 = sqlite3Fts3GetVarint32((char *)local_20,(int *)&local_28);
    }
    local_20 = local_20 + local_88;
    if (local_28 == 0) {
      local_44 = 0;
      goto LAB_0025035c;
    }
  }
  while (local_24 != local_28) {
    if ((int)local_24 < (int)local_28) {
      fts3ColumnlistCopy(in_stack_ffffffffffffff70,
                         (char **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (*local_18 == 0) goto LAB_002502cc;
      local_18 = local_18 + 1;
      if ((*local_18 & 0x80) == 0) {
        local_24 = (uint)*local_18;
        in_stack_ffffffffffffff64 = 1;
      }
      else {
        in_stack_ffffffffffffff64 = sqlite3Fts3GetVarint32((char *)local_18,(int *)&local_24);
      }
      local_18 = local_18 + in_stack_ffffffffffffff64;
    }
    else {
      fts3ColumnlistCopy(in_stack_ffffffffffffff70,
                         (char **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (*local_20 == 0) goto LAB_002502cc;
      local_20 = local_20 + 1;
      if ((*local_20 & 0x80) == 0) {
        local_28 = (uint)*local_20;
        in_stack_ffffffffffffff60 = 1;
      }
      else {
        in_stack_ffffffffffffff60 = sqlite3Fts3GetVarint32((char *)local_20,(int *)&local_28);
      }
      local_20 = local_20 + in_stack_ffffffffffffff60;
    }
  }
  if (local_24 != 0) {
    p_00 = local_10 + 1;
    *local_10 = '\x01';
    local_10 = p_00;
    iVar1 = sqlite3Fts3PutVarint(p_00,(long)(int)local_24);
    local_10 = local_10 + iVar1;
  }
  fts3GetDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (sqlite3_int64 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  fts3GetDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (sqlite3_int64 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
LAB_002502cc:
  fts3PoslistCopy(in_stack_ffffffffffffff70,
                  (char **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  fts3PoslistCopy(in_stack_ffffffffffffff70,
                  (char **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  *in_R8 = local_18;
  *in_R9 = local_20;
  if ((char *)*in_RDI == local_10) {
    local_44 = 0;
  }
  else {
    *local_10 = '\0';
    *in_RDI = local_10 + 1;
    local_44 = 1;
    local_10 = local_10 + 1;
  }
LAB_0025035c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert_fts3_nc( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
    /* iCol1==0 indicates corruption. Column 0 does not have a POS_COLUMN
    ** entry, so this is actually end-of-doclist. */
    if( iCol1==0 ) return 0;
  }
  if( *p2==POS_COLUMN ){
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
    /* As above, iCol2==0 indicates corruption. */
    if( iCol2==0 ) return 0;
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken)
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next
    ** column-number in the position list.
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}